

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::
GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_float,_float,_vkt::shaderexecutor::Void>_>
::~GenFuncCaseFactory
          (GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_float,_float,_vkt::shaderexecutor::Void>_>
           *this)

{
  (this->super_CaseFactory)._vptr_CaseFactory = (_func_int **)&PTR__GenFuncCaseFactory_00bf3068;
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

GenFuncCaseFactory	(const GenFuncs<Sig>& funcs, const string& name)
							: m_funcs			(funcs)
							, m_name			(de::toLower(name))
							{
							}